

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.h
# Opt level: O3

void __thiscall merlin::factor::factor(factor *this,variable_set *vs,value s)

{
  pointer pdVar1;
  pointer pdVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  long lVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  this->_vptr_factor = (_func_int **)&PTR__factor_001909d8;
  variable_set::variable_set(&this->v_,vs);
  (this->t_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->t_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->t_).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->c_ = -1;
  lVar5 = (long)(vs->m_v).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(vs->m_v).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar5 == 0) {
    lVar9 = 1;
  }
  else {
    lVar5 = lVar5 >> 3;
    lVar9 = 1;
    lVar7 = 0;
    do {
      lVar9 = lVar9 * vs->m_d[lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar5 + (ulong)(lVar5 == 0) != lVar7);
  }
  std::vector<double,_std::allocator<double>_>::resize(&this->t_,lVar9 + (ulong)(lVar9 == 0));
  auVar4 = _DAT_001760e0;
  auVar3 = _DAT_001760d0;
  pdVar1 = (this->t_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar2 = (this->t_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar1 != pdVar2) {
    uVar6 = (long)pdVar2 + (-8 - (long)pdVar1);
    auVar12._8_4_ = (int)uVar6;
    auVar12._0_8_ = uVar6;
    auVar12._12_4_ = (int)(uVar6 >> 0x20);
    auVar10._0_8_ = uVar6 >> 3;
    auVar10._8_8_ = auVar12._8_8_ >> 3;
    uVar8 = 0;
    auVar10 = auVar10 ^ _DAT_001760e0;
    do {
      auVar11._8_4_ = (int)uVar8;
      auVar11._0_8_ = uVar8;
      auVar11._12_4_ = (int)(uVar8 >> 0x20);
      auVar12 = (auVar11 | auVar3) ^ auVar4;
      if ((bool)(~(auVar12._4_4_ == auVar10._4_4_ && auVar10._0_4_ < auVar12._0_4_ ||
                  auVar10._4_4_ < auVar12._4_4_) & 1)) {
        pdVar1[uVar8] = s;
      }
      if ((auVar12._12_4_ != auVar10._12_4_ || auVar12._8_4_ <= auVar10._8_4_) &&
          auVar12._12_4_ <= auVar10._12_4_) {
        pdVar1[uVar8 + 1] = s;
      }
      uVar8 = uVar8 + 2;
    } while (((uVar6 >> 3) + 2 & 0xfffffffffffffffe) != uVar8);
  }
  return;
}

Assistant:

factor(variable_set const& vs, value s = 1.0) : v_(vs), t_(), c_(-1) {
		t_.resize(vs.num_states());
		set_dims();
		fill(s);
	}